

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

void __thiscall
LPCMStreamReader::restoreChannelData
          (LPCMStreamReader *this,uint8_t *start,uint8_t *end,int chNum,uint8_t *tmpData,int mch)

{
  uint local_64;
  int local_54;
  uint8_t *puStack_50;
  int j;
  uint8_t *src;
  uint8_t *curPos;
  int offset;
  int fullSampleSize;
  int ch1SampleSize;
  int mch_local;
  uint8_t *tmpData_local;
  int chNum_local;
  uint8_t *end_local;
  uint8_t *start_local;
  LPCMStreamReader *this_local;
  
  if (this->m_bitsPerSample == 0x14) {
    local_64 = 3;
  }
  else {
    local_64 = this->m_bitsPerSample / 8;
  }
  puStack_50 = tmpData;
  for (src = start + (int)(local_64 * (chNum + -1)); src < end; src = src + (int)(mch * local_64)) {
    for (local_54 = 0; local_54 < (int)local_64; local_54 = local_54 + 1) {
      src[local_54] = *puStack_50;
      puStack_50 = puStack_50 + 1;
    }
  }
  return;
}

Assistant:

void LPCMStreamReader::restoreChannelData(uint8_t* start, const uint8_t* end, const int chNum, const uint8_t* tmpData,
                                          const int mch) const
{
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = mch * ch1SampleSize;
    const int offset = ch1SampleSize * (chNum - 1);
    uint8_t* curPos = start + offset;
    const uint8_t* src = tmpData;
    for (; curPos < end; curPos += fullSampleSize)
    {
        for (int j = 0; j < ch1SampleSize; j++) curPos[j] = *src++;
    }
}